

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer_manager.cpp
# Opt level: O2

void __thiscall duckdb::CSVBufferManager::ResetBuffer(CSVBufferManager *this,idx_t buffer_idx)

{
  vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true> *this_00;
  ulong uVar1;
  reference pvVar2;
  CSVBuffer *pCVar3;
  __shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  key_type *pkVar5;
  iterator iVar6;
  size_type local_30;
  idx_t local_28;
  
  local_28 = buffer_idx;
  ::std::mutex::lock(&this->main_mutex);
  uVar1 = (long)(this->cached_buffers).
                super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->cached_buffers).
                super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (buffer_idx < uVar1) {
    this_00 = &this->cached_buffers;
    if (buffer_idx == 0) {
      if (1 < uVar1) {
        p_Var4 = (__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                 vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>(this_00,0);
        ::std::__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var4);
        pkVar5 = &local_28;
        while( true ) {
          local_30 = *pkVar5 + 1;
          iVar6 = ::std::
                  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->reset_when_possible)._M_h,&local_30);
          if (iVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)
          break;
          p_Var4 = (__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                   vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>
                             (this_00,local_30);
          ::std::__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var4);
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
          pkVar5 = &local_30;
        }
        goto LAB_01891bd4;
      }
    }
    else {
      pvVar2 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>
                         (this_00,buffer_idx - 1);
      if ((pvVar2->internal).super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        pvVar2 = vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>
                           (this_00,buffer_idx);
        pCVar3 = shared_ptr<duckdb::CSVBuffer,_true>::operator->(pvVar2);
        if (pCVar3->last_buffer == true) {
          ::std::
          vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
          ::clear(&this_00->
                   super_vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::CSVBuffer,_true>_>_>
                 );
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::clear(&(this->reset_when_possible)._M_h);
        }
        else {
          p_Var4 = (__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                   vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>
                             (this_00,buffer_idx);
          ::std::__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var4);
          pkVar5 = &local_28;
          while( true ) {
            local_30 = *pkVar5 + 1;
            iVar6 = ::std::
                    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(this->reset_when_possible)._M_h,&local_30);
            if (iVar6.super__Node_iterator_base<unsigned_long,_false>._M_cur == (__node_type *)0x0)
            break;
            p_Var4 = (__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                     vector<duckdb::shared_ptr<duckdb::CSVBuffer,_true>,_true>::get<true>
                               (this_00,local_30);
            ::std::__shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>::reset(p_Var4);
            ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(this->reset_when_possible)._M_h,&local_30);
            pkVar5 = &local_30;
          }
        }
        goto LAB_01891bd4;
      }
    }
    ::std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&this->reset_when_possible,&local_28);
  }
LAB_01891bd4:
  pthread_mutex_unlock((pthread_mutex_t *)&this->main_mutex);
  return;
}

Assistant:

void CSVBufferManager::ResetBuffer(const idx_t buffer_idx) {
	lock_guard<mutex> parallel_lock(main_mutex);
	if (buffer_idx >= cached_buffers.size()) {
		// Nothing to reset
		return;
	}
	D_ASSERT(cached_buffers[buffer_idx]);
	if (buffer_idx == 0 && cached_buffers.size() > 1) {
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
		return;
	}
	// We only reset if previous one was also already reset
	if (buffer_idx > 0 && !cached_buffers[buffer_idx - 1]) {
		if (cached_buffers[buffer_idx]->last_buffer) {
			// We clear the whole shebang
			cached_buffers.clear();
			reset_when_possible.clear();
			return;
		}
		cached_buffers[buffer_idx].reset();
		idx_t cur_buffer = buffer_idx + 1;
		while (reset_when_possible.find(cur_buffer) != reset_when_possible.end()) {
			cached_buffers[cur_buffer].reset();
			reset_when_possible.erase(cur_buffer);
			cur_buffer++;
		}
	} else {
		reset_when_possible.insert(buffer_idx);
	}
}